

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChunkV.cpp
# Opt level: O0

void __thiscall
adios2::format::ChunkV::ChunkV
          (ChunkV *this,string *type,bool AlwaysCopy,size_t MemAlign,size_t MemBlockSize,
          size_t ChunkSize)

{
  string *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R9;
  string *this_00;
  undefined1 in_stack_ffffffffffffffa7;
  string *in_stack_ffffffffffffffa8;
  BufferV *in_stack_ffffffffffffffb0;
  
  this_00 = (string *)&stack0xffffffffffffffb0;
  std::__cxx11::string::string(this_00,in_RSI);
  BufferV::BufferV(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   (bool)in_stack_ffffffffffffffa7,(size_t)this_00,(size_t)in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  *in_RDI = &PTR__ChunkV_01133a48;
  in_RDI[0x10] = in_R9;
  std::vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>::vector
            ((vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
              *)0xad9766);
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  return;
}

Assistant:

ChunkV::ChunkV(const std::string type, const bool AlwaysCopy, const size_t MemAlign,
               const size_t MemBlockSize, const size_t ChunkSize)
: BufferV(type, AlwaysCopy, MemAlign, MemBlockSize), m_ChunkSize(ChunkSize)
{
}